

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O1

bool __thiscall thread_pool::ThreadPool::TaskQueue::Pop(TaskQueue *this,function<void_()> *f)

{
  function<void_()> *__x;
  bool bVar1;
  bool bVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_38;
  
  local_38._M_device = &this->mutex;
  local_38._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  __x = (this->queue).c.
        super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur;
  bVar1 = (this->queue).c.
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur == __x;
  bVar2 = !bVar1;
  if (bVar1) {
    if (this->is_done == false) {
      do {
        std::condition_variable::wait((unique_lock *)&this->is_ready);
        __x = (this->queue).c.
              super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
        bVar2 = (this->queue).c.
                super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur != __x;
        if (bVar2) goto LAB_001092b4;
      } while (this->is_done == false);
    }
    if (bVar2 == false) goto LAB_001092c4;
  }
LAB_001092b4:
  std::function<void_()>::operator=(f,__x);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
            ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)this);
LAB_001092c4:
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return bVar2;
}

Assistant:

bool Pop(std::function<void()>* f) {
      std::unique_lock<std::mutex> lock(mutex);
      while (queue.empty() && !is_done) {
        is_ready.wait(lock);
      }
      if (queue.empty()) {
        return false;
      }
      *f = std::move(queue.front());
      queue.pop();
      return true;
    }